

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewParseTest.cpp
# Opt level: O0

void __thiscall
TApp_BuiltinComplexIgnoreI_Test::~TApp_BuiltinComplexIgnoreI_Test
          (TApp_BuiltinComplexIgnoreI_Test *this)

{
  TApp_BuiltinComplexIgnoreI_Test *this_local;
  
  TApp::~TApp(&this->super_TApp);
  return;
}

Assistant:

TEST_F(TApp, BuiltinComplexIgnoreI) {
    cx comp{1, 2};
    app.add_complex("-c,--complex", comp);

    args = {"-c", "4", "3i"};

    run();

    EXPECT_EQ(4, comp.real());
    EXPECT_EQ(3, comp.imag());
}